

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O2

void Message::putMessage(Result code,size_t value)

{
  mapped_type *s1;
  Result code_local;
  QArrayDataPointer<char16_t> local_40;
  QArrayDataPointer<char16_t> local_28;
  
  code_local = code;
  s1 = std::
       map<Result,_QString,_std::less<Result>,_std::allocator<std::pair<const_Result,_QString>_>_>::
       at(&message,&code_local);
  operator+((QString *)&local_28,s1,"%1 \t\n\n");
  QString::arg((ulonglong)&local_40,(int)&local_28,(int)value,(QChar)0x0);
  std::deque<QString,_std::allocator<QString>_>::emplace_back<QString>
            (&messageQueue.c,(QString *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  return;
}

Assistant:

void Message::putMessage( Result code, size_t value )
{
    messageQueue.push( QString( message.at( code ) + "%1 \t\n\n" ).arg( value ));
}